

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::bt_peer_connection::on_extended(bt_peer_connection *this,int received)

{
  piece_index_t pVar1;
  bool bVar2;
  byte bVar3;
  uint8_t uVar4;
  int iVar5;
  uint uVar6;
  int32_t val;
  index_type iVar7;
  list<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
  *this_00;
  element_type *peVar8;
  char *pcVar9;
  error_code local_c8;
  undefined8 local_b8;
  undefined8 local_b0;
  __shared_ptr_access<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_a8;
  shared_ptr<libtorrent::peer_plugin> *e;
  iterator __end2;
  iterator __begin2;
  list<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
  *__range2;
  byte local_7e;
  byte local_7d;
  piece_index_t piece;
  bool sm;
  bool ul;
  int extended_id;
  undefined1 local_68 [8];
  span<const_char> recv_buffer;
  error_code local_50;
  undefined1 local_40 [52];
  int received_local;
  bt_peer_connection *this_local;
  
  local_40._44_4_ = received;
  unique0x10000686 = this;
  peer_connection::received_bytes(&this->super_peer_connection,0,received);
  iVar5 = crypto_receive_buffer::packet_size(&this->m_recv_buffer);
  if (iVar5 < 2) {
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              ((error_code *)(local_40 + 0x18),invalid_extended,(type *)0x0);
    local_40[0x17] = 2;
    (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
              (this,local_40 + 0x18,1,2);
  }
  else {
    peer_connection::associated_torrent((peer_connection *)local_40);
    bVar2 = ::std::__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::expired
                      ((__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)local_40)
    ;
    ::std::weak_ptr<libtorrent::aux::torrent>::~weak_ptr
              ((weak_ptr<libtorrent::aux::torrent> *)local_40);
    if (bVar2) {
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                (&local_50,invalid_extended,(type *)0x0);
      recv_buffer.m_len._7_1_ = 2;
      (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
                (this,&local_50,1,2);
    }
    else {
      _local_68 = crypto_receive_buffer::get(&this->m_recv_buffer);
      iVar7 = span<const_char>::size((span<const_char> *)local_68);
      if (1 < (int)iVar7) {
        _local_68 = span<const_char>::subspan((span<const_char> *)local_68,1);
        bVar3 = read_uint8<char_const>((span<const_char> *)local_68);
        piece.m_val = (int)bVar3;
        if (piece.m_val == 0) {
          on_extended_handshake(this);
          peer_connection::disconnect_if_redundant(&this->super_peer_connection);
        }
        else if (piece.m_val == 3) {
          bVar2 = crypto_receive_buffer::packet_finished(&this->m_recv_buffer);
          if (bVar2) {
            iVar5 = crypto_receive_buffer::packet_size(&this->m_recv_buffer);
            if (iVar5 == 3) {
              uVar4 = read_uint8<char_const>((span<const_char> *)local_68);
              local_7d = uVar4 != '\0';
              pcVar9 = "false";
              if ((bool)local_7d) {
                pcVar9 = "true";
              }
              peer_connection::peer_log
                        (&this->super_peer_connection,incoming_message,"UPLOAD_ONLY","%s",pcVar9);
              peer_connection::set_upload_only(&this->super_peer_connection,(bool)(local_7d & 1));
            }
            else {
              uVar6 = crypto_receive_buffer::packet_size(&this->m_recv_buffer);
              peer_connection::peer_log
                        (&this->super_peer_connection,incoming_message,"UPLOAD_ONLY",
                         "ERROR: unexpected packet size: %d",(ulong)uVar6);
            }
          }
        }
        else if (piece.m_val == 8) {
          bVar2 = crypto_receive_buffer::packet_finished(&this->m_recv_buffer);
          if (bVar2) {
            iVar5 = crypto_receive_buffer::packet_size(&this->m_recv_buffer);
            if (iVar5 == 3) {
              uVar4 = read_uint8<char_const>((span<const_char> *)local_68);
              local_7e = uVar4 != '\0';
              pcVar9 = "false";
              if ((bool)local_7e) {
                pcVar9 = "true";
              }
              peer_connection::peer_log
                        (&this->super_peer_connection,incoming_message,"SHARE_MODE","%s",pcVar9);
              peer_connection::set_share_mode(&this->super_peer_connection,(bool)(local_7e & 1));
            }
            else {
              uVar6 = crypto_receive_buffer::packet_size(&this->m_recv_buffer);
              peer_connection::peer_log
                        (&this->super_peer_connection,incoming_message,"SHARE_MODE",
                         "ERROR: unexpected packet size: %d",(ulong)uVar6);
            }
          }
        }
        else if (piece.m_val == 4) {
          bVar2 = crypto_receive_buffer::packet_finished(&this->m_recv_buffer);
          if (bVar2) {
            peer_connection::peer_log(&this->super_peer_connection,incoming_message,"HOLEPUNCH");
            on_holepunch(this);
          }
        }
        else if (piece.m_val == 7) {
          bVar2 = crypto_receive_buffer::packet_finished(&this->m_recv_buffer);
          if (bVar2) {
            iVar5 = crypto_receive_buffer::packet_size(&this->m_recv_buffer);
            if (iVar5 == 6) {
              val = read_int32<char_const>((span<const_char> *)local_68);
              strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef
                        ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                         ((long)&__range2 + 4),val);
              __range2._0_4_ = __range2._4_4_;
              peer_connection::incoming_dont_have(&this->super_peer_connection,__range2._4_4_);
            }
            else {
              uVar6 = crypto_receive_buffer::packet_size(&this->m_recv_buffer);
              peer_connection::peer_log
                        (&this->super_peer_connection,incoming_message,"DONT_HAVE",
                         "ERROR: unexpected packet size: %d",(ulong)uVar6);
            }
          }
        }
        else {
          bVar2 = crypto_receive_buffer::packet_finished(&this->m_recv_buffer);
          pVar1.m_val = piece.m_val;
          if (bVar2) {
            uVar6 = crypto_receive_buffer::packet_size(&this->m_recv_buffer);
            peer_connection::peer_log
                      (&this->super_peer_connection,incoming_message,"EXTENSION_MESSAGE",
                       "msg: %d size: %d",(ulong)(uint)pVar1.m_val,(ulong)uVar6);
          }
          this_00 = &(this->super_peer_connection).m_extensions;
          __end2 = ::std::__cxx11::
                   list<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
                   ::begin(this_00);
          e = (shared_ptr<libtorrent::peer_plugin> *)
              ::std::__cxx11::
              list<std::shared_ptr<libtorrent::peer_plugin>,_std::allocator<std::shared_ptr<libtorrent::peer_plugin>_>_>
              ::end(this_00);
          while (bVar2 = ::std::operator!=(&__end2,(_Self *)&e), bVar2) {
            local_a8 = (__shared_ptr_access<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)::std::_List_iterator<std::shared_ptr<libtorrent::peer_plugin>_>::
                          operator*(&__end2);
            peVar8 = ::std::
                     __shared_ptr_access<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->(local_a8);
            iVar5 = crypto_receive_buffer::packet_size(&this->m_recv_buffer);
            pVar1 = piece;
            span<char_const>::span<libtorrent::span<char_const>,char_const,void>
                      ((span<char_const> *)&local_b8,(span<const_char> *)local_68);
            uVar6 = (*peVar8->_vptr_peer_plugin[0x26])
                              (peVar8,(ulong)(iVar5 - 2),(ulong)(uint)pVar1.m_val,local_b8,local_b0)
            ;
            if ((uVar6 & 1) != 0) {
              return;
            }
            ::std::_List_iterator<std::shared_ptr<libtorrent::peer_plugin>_>::operator++(&__end2);
          }
          boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                    (&local_c8,invalid_message,(type *)0x0);
          (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
                    (this,&local_c8,1,2);
        }
      }
    }
  }
  return;
}

Assistant:

void bt_peer_connection::on_extended(int received)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(received >= 0);
		received_bytes(0, received);
		if (m_recv_buffer.packet_size() < 2)
		{
			disconnect(errors::invalid_extended, operation_t::bittorrent, peer_error);
			return;
		}

		if (associated_torrent().expired())
		{
			disconnect(errors::invalid_extended, operation_t::bittorrent, peer_error);
			return;
		}

		span<char const> recv_buffer = m_recv_buffer.get();
		if (int(recv_buffer.size()) < 2) return;

		TORRENT_ASSERT(recv_buffer.front() == msg_extended);
		recv_buffer = recv_buffer.subspan(1);

		int const extended_id = aux::read_uint8(recv_buffer);

		if (extended_id == 0)
		{
			on_extended_handshake();
			disconnect_if_redundant();
			return;
		}

		if (extended_id == upload_only_msg)
		{
			if (!m_recv_buffer.packet_finished()) return;
			if (m_recv_buffer.packet_size() != 3)
			{
#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::incoming_message, "UPLOAD_ONLY"
					, "ERROR: unexpected packet size: %d", m_recv_buffer.packet_size());
#endif
				return;
			}
			bool const ul = aux::read_uint8(recv_buffer) != 0;
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::incoming_message, "UPLOAD_ONLY"
				, "%s", (ul?"true":"false"));
#endif
			set_upload_only(ul);
			return;
		}

#ifndef TORRENT_DISABLE_SHARE_MODE
		if (extended_id == share_mode_msg)
		{
			if (!m_recv_buffer.packet_finished()) return;
			if (m_recv_buffer.packet_size() != 3)
			{
#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::incoming_message, "SHARE_MODE"
					, "ERROR: unexpected packet size: %d", m_recv_buffer.packet_size());
#endif
				return;
			}
			bool sm = aux::read_uint8(recv_buffer) != 0;
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::incoming_message, "SHARE_MODE"
				, "%s", (sm?"true":"false"));
#endif
			set_share_mode(sm);
			return;
		}
#endif // TORRENT_DISABLE_SHARE_MODE

		if (extended_id == holepunch_msg)
		{
			if (!m_recv_buffer.packet_finished()) return;
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::incoming_message, "HOLEPUNCH");
#endif
			on_holepunch();
			return;
		}

		if (extended_id == dont_have_msg)
		{
			if (!m_recv_buffer.packet_finished()) return;
			if (m_recv_buffer.packet_size() != 6)
			{
#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::incoming_message, "DONT_HAVE"
					, "ERROR: unexpected packet size: %d", m_recv_buffer.packet_size());
#endif
				return;
			}
			piece_index_t const piece(aux::read_int32(recv_buffer));
			incoming_dont_have(piece);
			return;
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (m_recv_buffer.packet_finished())
			peer_log(peer_log_alert::incoming_message, "EXTENSION_MESSAGE"
				, "msg: %d size: %d", extended_id, m_recv_buffer.packet_size());
#endif

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto const& e : m_extensions)
		{
			if (e->on_extended(m_recv_buffer.packet_size() - 2, extended_id
				, recv_buffer))
				return;
		}
#endif

		disconnect(errors::invalid_message, operation_t::bittorrent, peer_error);
	}